

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O2

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *this_00;
  AcceptingStates AVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  ulong extraout_RAX;
  atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *paVar5;
  long lVar6;
  undefined4 in_register_00000034;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  error_code ec;
  AcceptingStates exp;
  ulong uVar4;
  
  this_00 = &this->state;
  if ((this->state)._M_i == HALTED) {
    LOCK();
    this_00->_M_i = OPENED;
    UNLOCK();
  }
  exp = OPENED;
  paVar5 = (atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)0x5;
  bVar2 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::compare_exchange_strong
                    (this_00,&exp,CONNECTING,seq_cst);
  uVar4 = CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    lVar6 = 0;
    bVar2 = false;
    while (!bVar2) {
      ec._M_value = 0;
      ec._M_cat = (error_category *)std::_V2::system_category();
      asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::bind
                (&this->acceptor_,(int)this + 0x10,(sockaddr *)&ec,(socklen_t)paVar5);
      if (ec._M_value == 0) {
        LOCK();
        AVar1 = this_00->_M_i;
        this_00->_M_i = CONNECTED;
        uVar4 = (ulong)AVar1;
        UNLOCK();
        bVar2 = true;
        paVar5 = this_00;
      }
      else {
        if (CONCAT44(in_register_00000034,__fd) < lVar6) {
          LOCK();
          this_00->_M_i = OPENED;
          UNLOCK();
          return 0;
        }
        local_50.__r = 200;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
        lVar6 = lVar6 + 200;
        uVar4 = extraout_RAX;
      }
    }
    iVar3 = (int)CONCAT71((int7)(uVar4 >> 8),1);
  }
  else {
    iVar3 = CONCAT31((int3)(this_00->_M_i >> 8),this_00->_M_i == CONNECTED);
  }
  return iVar3;
}

Assistant:

bool TcpAcceptor::connect(std::chrono::milliseconds timeOut)
{
    if (state == AcceptingStates::HALTED) {
        state = AcceptingStates::OPENED;
    }
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        bool bindsuccess = false;
        std::chrono::milliseconds tcount{0};
        while (!bindsuccess) {
            std::error_code ec;
            acceptor_.bind(endpoint_, ec);
            if (ec) {
                if (tcount > timeOut) {
                    state = AcceptingStates::OPENED;
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                tcount += std::chrono::milliseconds(200);
            } else {
                state = AcceptingStates::CONNECTED;
                bindsuccess = true;
            }
        }
        return bindsuccess;
    }
    return (state == AcceptingStates::CONNECTED);
}